

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdLoadByte(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx_local._3_1_ = cmd.rC;
  ctx_local._4_4_ = cmd.argument;
  GenCodeLoadInt8FromPointer(ctx,rEAX,rEAX,ctx_local._3_1_,ctx_local._4_4_);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  ctx_local._1_1_ = cmd.rA;
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3,rEAX);
  return;
}

Assistant:

void GenCodeCmdLoadByte(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	GenCodeLoadInt8FromPointer(ctx, rRAX, rEAX, cmd.rC, cmd.argument);

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store int to target
#else
	x86GenCodeLoadInt8FromPointer(ctx, rEAX, rEAX, cmd.rC, cmd.argument);

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store int to target
#endif
}